

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPFakeTransmitter::SendRTPData(RTPFakeTransmitter *this,void *data,size_t len)

{
  HashElement *pHVar1;
  int iVar2;
  
  iVar2 = -0x84;
  if (((this->init == true) && (iVar2 = -0x83, this->created == true)) &&
     (iVar2 = -0x86, len <= this->maxpacksize)) {
    pHVar1 = (this->destinations).firsthashelem;
    (this->destinations).curhashelem = pHVar1;
    iVar2 = 0;
    if (pHVar1 != (HashElement *)0x0) {
      do {
        (*this->params->packetreadycb)
                  (this->params->packetreadycbdata,(uint8_t *)data,(uint16_t)len,
                   (pHVar1->element).rtpaddr.sin_addr.s_addr,(pHVar1->element).rtpaddr.sin_port,1);
        pHVar1 = (this->destinations).curhashelem;
        if (pHVar1 == (HashElement *)0x0) {
          return 0;
        }
        pHVar1 = pHVar1->listnext;
        (this->destinations).curhashelem = pHVar1;
        iVar2 = 0;
      } while (pHVar1 != (HashElement *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int RTPFakeTransmitter::SendRTPData(const void *data,size_t len)	
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_SPECIFIEDSIZETOOBIG;
	}


	destinations.GotoFirstElement();
    // send to each destination
	while (destinations.HasCurrentElement())
	{
        (*params->GetPacketReadyCB())(params->GetPacketReadyCBData(), (uint8_t*)data, len,
        destinations.GetCurrentElement().GetIP_NBO(),
        destinations.GetCurrentElement().GetRTPPort_NBO(),
        1);
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}